

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O2

bool __thiscall SNMPPacket::build(SNMPPacket *this)

{
  shared_ptr<ComplexType> *psVar1;
  element_type *peVar2;
  element_type *newObj;
  ComplexType *pCVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<ComplexType> varBindList;
  shared_ptr<ComplexType> snmpPDU;
  element_type *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_d0 [2];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (this->packet != (ComplexType *)0x0) {
    (*(this->packet->super_BER_CONTAINER)._vptr_BER_CONTAINER[1])();
  }
  pCVar3 = (ComplexType *)operator_new(0x28);
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(pCVar3->super_BER_CONTAINER)._type)->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x30;
  (pCVar3->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__ComplexType_00116f48;
  (pCVar3->values).
  super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pCVar3->values).
  super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar3->values).
  super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->packet = pCVar3;
  if ((this->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::make_shared<IntegerType,SnmpVersionEnum&>((SnmpVersionEnum *)&varBindList);
    psVar1 = &varBindList;
    snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList
              ((ComplexType *)(local_50 + 0x10),(shared_ptr<BER_CONTAINER> *)pCVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<IntegerType,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)&snmpPDU,
               &(this->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>);
    ComplexType::addValueToList((ComplexType *)(local_38 + 1),(shared_ptr<BER_CONTAINER> *)pCVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
    psVar1 = &snmpPDU;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(psVar1->super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  pCVar3 = this->packet;
  if ((this->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_d8 = (element_type *)(this->communityString)._M_dataplus._M_p;
    std::make_shared<OctetType,char_const*>((char **)&varBindList);
    psVar1 = &varBindList;
    snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList((ComplexType *)local_60,(shared_ptr<BER_CONTAINER> *)pCVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<OctetType,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)&snmpPDU,
               &(this->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>
              );
    ComplexType::addValueToList((ComplexType *)local_50,(shared_ptr<BER_CONTAINER> *)pCVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    psVar1 = &snmpPDU;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(psVar1->super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE&>((ASN_TYPE_WITH_VALUE *)&snmpPDU);
  peVar2 = snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((this->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::make_shared<IntegerType,unsigned_long&>((unsigned_long *)&local_d8);
    this_00 = a_Stack_d0;
    varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
    varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_d0[0]._M_pi;
    local_d8 = (element_type *)0x0;
    a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList((ComplexType *)local_80,(shared_ptr<BER_CONTAINER> *)peVar2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  else {
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<IntegerType,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)&varBindList,
               &(this->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>);
    ComplexType::addValueToList((ComplexType *)local_70,(shared_ptr<BER_CONTAINER> *)peVar2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    this_00 = &varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  peVar2 = snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::make_shared<IntegerType,ERROR_STATUS_WITH_VALUE&>((ERROR_STATUS_WITH_VALUE *)&local_d8);
  varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_d0[0]._M_pi;
  local_d8 = (element_type *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ComplexType::addValueToList((ComplexType *)local_90,(shared_ptr<BER_CONTAINER> *)peVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_d0);
  peVar2 = snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::make_shared<IntegerType,int&>((int *)&local_d8);
  varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_d0[0]._M_pi;
  local_d8 = (element_type *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ComplexType::addValueToList((ComplexType *)local_a0,(shared_ptr<BER_CONTAINER> *)peVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_d0);
  (*this->_vptr_SNMPPacket[3])(&varBindList,this);
  newObj = snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ComplexType,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
               &varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>);
    ComplexType::addValueToList((ComplexType *)local_b0,(shared_ptr<BER_CONTAINER> *)newObj);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_d0);
    pCVar3 = this->packet;
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ComplexType,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
               &snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>);
    ComplexType::addValueToList((ComplexType *)local_c0,(shared_ptr<BER_CONTAINER> *)pCVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_d0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return peVar2 != (element_type *)0x0;
}

Assistant:

bool SNMPPacket::build(){
    // Delete the existing packet if we've built it before (generally only traps)
    delete this->packet;

    this->packet = new ComplexType(STRUCTURE);
    // Try to reuse existing containers if we got em
    if(this->snmpVersionPtr)
        this->packet->addValueToList(this->snmpVersionPtr);
    else
        this->packet->addValueToList(std::make_shared<IntegerType>(this->snmpVersion));

    if(this->communityStringPtr)
        this->packet->addValueToList(this->communityStringPtr);
    else
        this->packet->addValueToList(std::make_shared<OctetType>(this->communityString.c_str()));

    auto snmpPDU = std::make_shared<ComplexType>(this->packetPDUType);

    if(this->requestIDPtr)
        snmpPDU->addValueToList(this->requestIDPtr);
    else
        snmpPDU->addValueToList(std::make_shared<IntegerType>(this->requestID));


    snmpPDU->addValueToList(std::make_shared<IntegerType>(this->errorStatus.errorStatus));
    snmpPDU->addValueToList(std::make_shared<IntegerType>(this->errorIndex.errorIndex));

    // We need to do this dynamically incase we're building a trap, generateVarBindList is virtual
    auto varBindList = this->generateVarBindList();
    if(!varBindList) return false;
    
    snmpPDU->addValueToList(varBindList);

    this->packet->addValueToList(snmpPDU);

    return true;
}